

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEsop.c
# Opt level: O1

int Eso_ManComputeAnd(Eso_Man_t *p,Vec_Int_t *vCube1,Vec_Int_t *vCube2,Vec_Int_t *vCube)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  int iVar6;
  uint *puVar7;
  uint *puVar8;
  uint *puVar9;
  
  puVar5 = (uint *)vCube->pArray;
  puVar9 = (uint *)vCube1->pArray;
  puVar7 = (uint *)vCube2->pArray;
  puVar1 = puVar9 + vCube1->nSize;
  puVar2 = puVar7 + vCube2->nSize;
  puVar8 = puVar5;
  if (0 < vCube2->nSize && 0 < (long)vCube1->nSize) {
    do {
      uVar3 = *puVar9;
      uVar4 = *puVar7;
      if (uVar3 == uVar4) {
        puVar9 = puVar9 + 1;
        *puVar8 = uVar3;
        puVar7 = puVar7 + 1;
      }
      else {
        if (((int)uVar3 < 0) || ((int)uVar4 < 0)) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        if ((uVar4 ^ uVar3) < 2) {
          return -1;
        }
        if ((int)uVar3 < (int)uVar4) {
          puVar9 = puVar9 + 1;
          *puVar8 = uVar3;
        }
        else {
          puVar7 = puVar7 + 1;
          *puVar8 = uVar4;
        }
      }
      puVar8 = puVar8 + 1;
    } while ((puVar9 < puVar1) && (puVar7 < puVar2));
  }
  for (; puVar9 < puVar1; puVar9 = puVar9 + 1) {
    *puVar8 = *puVar9;
    puVar8 = puVar8 + 1;
  }
  for (; puVar7 < puVar2; puVar7 = puVar7 + 1) {
    *puVar8 = *puVar7;
    puVar8 = puVar8 + 1;
  }
  iVar6 = (int)((ulong)((long)puVar8 - (long)puVar5) >> 2);
  vCube->nSize = iVar6;
  if (iVar6 <= vCube->nCap) {
    if (iVar6 < vCube1->nSize) {
      __assert_fail("vCube->nSize >= vCube1->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEsop.c"
                    ,0x195,
                    "int Eso_ManComputeAnd(Eso_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
    }
    if (iVar6 < vCube2->nSize) {
      __assert_fail("vCube->nSize >= vCube2->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEsop.c"
                    ,0x196,
                    "int Eso_ManComputeAnd(Eso_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
    }
    iVar6 = Hsh_VecManAdd(p->pHash,vCube);
    return iVar6;
  }
  __assert_fail("vCube->nSize <= vCube->nCap",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEsop.c"
                ,0x194,"int Eso_ManComputeAnd(Eso_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

int Eso_ManComputeAnd( Eso_Man_t * p, Vec_Int_t * vCube1, Vec_Int_t * vCube2, Vec_Int_t * vCube )
{
    int * pBeg  = vCube->pArray;
    int * pBeg1 = vCube1->pArray;
    int * pBeg2 = vCube2->pArray;
    int * pEnd1 = vCube1->pArray + vCube1->nSize;
    int * pEnd2 = vCube2->pArray + vCube2->nSize;
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( *pBeg1 == *pBeg2 )
            *pBeg++ = *pBeg1++, pBeg2++;
        else if ( Abc_Lit2Var(*pBeg1) == Abc_Lit2Var(*pBeg2) )
            return -1;
        else if ( *pBeg1 < *pBeg2 )
            *pBeg++ = *pBeg1++;
        else 
            *pBeg++ = *pBeg2++;
    }
    while ( pBeg1 < pEnd1 )
        *pBeg++ = *pBeg1++;
    while ( pBeg2 < pEnd2 )
        *pBeg++ = *pBeg2++;
    vCube->nSize = pBeg - vCube->pArray;
    assert( vCube->nSize <= vCube->nCap );
    assert( vCube->nSize >= vCube1->nSize );
    assert( vCube->nSize >= vCube2->nSize );
    return Hsh_VecManAdd( p->pHash, vCube );
}